

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O2

void __thiscall
DIS::LinearObjectStatePdu::unmarshal(LinearObjectStatePdu *this,DataStream *dataStream)

{
  ulong uVar1;
  LinearSegmentParameter x;
  LinearSegmentParameter LStack_78;
  
  SyntheticEnvironmentFamilyPdu::unmarshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_objectID,dataStream);
  EntityID::unmarshal(&this->_referencedObjectID,dataStream);
  DataStream::operator>>(dataStream,&this->_updateNumber);
  DataStream::operator>>(dataStream,&this->_forceID);
  DataStream::operator>>(dataStream,&this->_numberOfSegments);
  SimulationAddress::unmarshal(&this->_requesterID,dataStream);
  SimulationAddress::unmarshal(&this->_receivingID,dataStream);
  ObjectType::unmarshal(&this->_objectType,dataStream);
  std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::clear
            (&this->_linearSegmentParameters);
  for (uVar1 = 0; uVar1 < this->_numberOfSegments; uVar1 = uVar1 + 1) {
    LinearSegmentParameter::LinearSegmentParameter(&LStack_78);
    LinearSegmentParameter::unmarshal(&LStack_78,dataStream);
    std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::
    push_back(&this->_linearSegmentParameters,&LStack_78);
    LinearSegmentParameter::~LinearSegmentParameter(&LStack_78);
  }
  return;
}

Assistant:

void LinearObjectStatePdu::unmarshal(DataStream& dataStream)
{
    SyntheticEnvironmentFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _objectID.unmarshal(dataStream);
    _referencedObjectID.unmarshal(dataStream);
    dataStream >> _updateNumber;
    dataStream >> _forceID;
    dataStream >> _numberOfSegments;
    _requesterID.unmarshal(dataStream);
    _receivingID.unmarshal(dataStream);
    _objectType.unmarshal(dataStream);

     _linearSegmentParameters.clear();
     for(size_t idx = 0; idx < _numberOfSegments; idx++)
     {
        LinearSegmentParameter x;
        x.unmarshal(dataStream);
        _linearSegmentParameters.push_back(x);
     }
}